

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void __thiscall
jaegertracing::agent::thrift::AgentProcessor::process_emitZipkinBatch
          (AgentProcessor *this,int32_t param_1,TProtocol *iprot,TProtocol *param_3,
          void *callContext)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *__nbytes;
  void *__buf;
  exception *anon_var_0;
  int local_8c;
  undefined1 local_88 [4];
  uint32_t bytes;
  Agent_emitZipkinBatch_args args;
  undefined1 local_50 [8];
  TProcessorContextFreer freer;
  void *ctx;
  void *callContext_local;
  TProtocol *param_3_local;
  TProtocol *iprot_local;
  int32_t param_1_local;
  AgentProcessor *this_local;
  
  freer.method_ = (char *)0x0;
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    freer.method_ =
         (char *)(**(code **)(*(long *)peVar3 + 0x10))(peVar3,"Agent.emitZipkinBatch",callContext);
  }
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  __nbytes = "Agent.emitZipkinBatch";
  apache::thrift::TProcessorContextFreer::TProcessorContextFreer
            ((TProcessorContextFreer *)local_50,peVar2,freer.method_,"Agent.emitZipkinBatch");
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    (**(code **)(*(long *)peVar3 + 0x20))(peVar3,freer.method_,"Agent.emitZipkinBatch");
  }
  Agent_emitZipkinBatch_args::Agent_emitZipkinBatch_args((Agent_emitZipkinBatch_args *)local_88);
  Agent_emitZipkinBatch_args::read
            ((Agent_emitZipkinBatch_args *)local_88,(int)iprot,__buf,(size_t)__nbytes);
  apache::thrift::protocol::TProtocol::readMessageEnd(iprot);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)&anon_var_0);
  peVar4 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&anon_var_0);
  iVar1 = (*peVar4->_vptr_TTransport[8])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)&anon_var_0);
  local_8c = iVar1;
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    (**(code **)(*(long *)peVar3 + 0x28))(peVar3,freer.method_,"Agent.emitZipkinBatch",local_8c);
  }
  peVar5 = std::
           __shared_ptr_access<jaegertracing::agent::thrift::AgentIf,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::agent::thrift::AgentIf,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->iface_);
  (*peVar5->_vptr_AgentIf[2])(peVar5,&args);
  peVar2 = std::__shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>::
           get(&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_.
                super___shared_ptr<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2>
              );
  if (peVar2 != (element_type *)0x0) {
    peVar3 = std::
             __shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::TProcessorEventHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TDispatchProcessor).super_TProcessor.eventHandler_);
    (**(code **)(*(long *)peVar3 + 0x40))(peVar3,freer.method_,"Agent.emitZipkinBatch");
  }
  Agent_emitZipkinBatch_args::~Agent_emitZipkinBatch_args((Agent_emitZipkinBatch_args *)local_88);
  apache::thrift::TProcessorContextFreer::~TProcessorContextFreer
            ((TProcessorContextFreer *)local_50);
  return;
}

Assistant:

void AgentProcessor::process_emitZipkinBatch(int32_t, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol*, void* callContext)
{
  void* ctx = NULL;
  if (this->eventHandler_.get() != NULL) {
    ctx = this->eventHandler_->getContext("Agent.emitZipkinBatch", callContext);
  }
  ::apache::thrift::TProcessorContextFreer freer(this->eventHandler_.get(), ctx, "Agent.emitZipkinBatch");

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->preRead(ctx, "Agent.emitZipkinBatch");
  }

  Agent_emitZipkinBatch_args args;
  args.read(iprot);
  iprot->readMessageEnd();
  uint32_t bytes = iprot->getTransport()->readEnd();

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->postRead(ctx, "Agent.emitZipkinBatch", bytes);
  }

  try {
    iface_->emitZipkinBatch(args.spans);
  } catch (const std::exception&) {
    if (this->eventHandler_.get() != NULL) {
      this->eventHandler_->handlerError(ctx, "Agent.emitZipkinBatch");
    }
    return;
  }

  if (this->eventHandler_.get() != NULL) {
    this->eventHandler_->asyncComplete(ctx, "Agent.emitZipkinBatch");
  }

  return;
}